

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int encoder_append_type(ndn_encoder_t *encoder,uint32_t type)

{
  int iVar1;
  uint32_t type_local;
  ndn_encoder_t *encoder_local;
  
  iVar1 = encoder_append_var(encoder,type);
  return iVar1;
}

Assistant:

static inline int
encoder_append_type(ndn_encoder_t* encoder, uint32_t type)
{
  return encoder_append_var(encoder, type);
}